

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allnodes.cpp
# Opt level: O2

int define_till_no_keyword
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *b,int i,datanode *node,int width)

{
  pointer pbVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  string type;
  string IOWG;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  uVar5 = (ulong)i;
  std::__cxx11::string::string
            (local_70,(string *)
                      ((b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + (uVar5 - 1)));
  std::__cxx11::string::string
            (local_90,(string *)
                      ((b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar5));
  lVar4 = uVar5 * 0x20 + 0x40;
  do {
    pbVar1 = (b->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 5U <= uVar5) {
LAB_001054d0:
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_70);
      return (int)uVar5;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pbVar1[-1]._M_dataplus._M_p + lVar4),"input");
    if (bVar2) {
LAB_001054cd:
      uVar5 = uVar5 + 1;
      goto LAB_001054d0;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(b->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p
                            + lVar4),"output");
    if (bVar2) goto LAB_001054cd;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(b->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p
                            + lVar4),"wire");
    if (bVar2) goto LAB_001054cd;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(b->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p
                            + lVar4),"register");
    if (bVar2) goto LAB_001054cd;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((b->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar4),"=");
    if (bVar2) goto LAB_001054cd;
    lVar3 = std::__cxx11::string::find
                      ((char *)((long)&(b->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus.
                                       _M_p + lVar4),0x10a09b);
    if (lVar3 == -1) {
      std::__cxx11::string::_M_assign((string *)(node + nodepointer));
    }
    else {
      std::__cxx11::string::substr
                ((ulong)local_50,
                 (long)&(b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p + lVar4);
      std::__cxx11::string::operator=((string *)(node + nodepointer),local_50);
      std::__cxx11::string::~string(local_50);
    }
    std::__cxx11::string::_M_assign((string *)&node[nodepointer].typeofIOWG);
    std::__cxx11::string::_M_assign((string *)&node[nodepointer].type);
    node[nodepointer].width = width;
    node[nodepointer].delay = 0.0;
    nodepointer = nodepointer + 1;
    lVar4 = lVar4 + 0x20;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int define_till_no_keyword(vector<string>&b, int i, struct datanode *node, int width) {

string IOWG = b[i - 1];
string type = b[i];
while (i < b.size()-5)
{
	i++;

			if (b[i] == "input" || b[i] == "output" || b[i] == "wire" || b[i] == "register" || b[i + 1] == "=")
			{
				return i;
			}
			else
			{
				if (b[i].find(",") != string::npos)
				{
					node[nodepointer].name = b[i].substr(0, b[i].length() - 1);
				}
				else
					node[nodepointer].name = b[i];
				
				node[nodepointer].typeofIOWG = IOWG;
				node[nodepointer].type = type;
				node[nodepointer].width = width;
				node[nodepointer].delay = 0.0;
				nodepointer++;
			}
			
}
return i;
}